

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  OfType OVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pcVar5;
  string *psVar6;
  int iVar7;
  XmlWriter *pXVar8;
  undefined1 auVar9 [8];
  AssertionStats *pAVar10;
  string *text;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  ScopedElement scoped_5;
  string local_d0;
  undefined1 local_b0 [8];
  ScopedElement scoped;
  undefined1 local_a0 [24];
  undefined1 local_88 [40];
  AssertionStats *local_60;
  XmlReporter *local_58;
  undefined1 local_50 [8];
  ScopedElement scoped_2;
  
  local_60 = assertionStats;
  local_58 = this;
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar3 != pMVar4) {
      pXVar8 = (XmlWriter *)(local_88 + 0x10);
      pXVar1 = &this->m_xml;
      text = &pMVar3->message;
      do {
        iVar7 = *(int *)((long)&text[-1].field_2 + 8);
        if (iVar7 == 2) {
          local_88._0_8_ = pXVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Warning","");
          local_b0 = (undefined1  [8])pXVar1;
          XmlWriter::startElement(pXVar1,(string *)local_88);
          XmlWriter::writeText((XmlWriter *)local_b0,text,true);
LAB_0013adfb:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
          if ((XmlWriter *)local_88._0_8_ != pXVar8) {
            operator_delete((void *)local_88._0_8_);
          }
        }
        else if (iVar7 == 1) {
          local_88._0_8_ = pXVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Info","");
          local_b0 = (undefined1  [8])pXVar1;
          XmlWriter::startElement(pXVar1,(string *)local_88);
          XmlWriter::writeText((XmlWriter *)local_b0,text,true);
          goto LAB_0013adfb;
        }
        psVar6 = text + 1;
        text = (string *)((long)&text[3].field_2 + 8);
      } while ((pointer)&psVar6->_M_string_length != pMVar4);
    }
  }
  iVar7 = (*(((local_58->super_StreamingReporterBase).m_config.m_p)->super_IShared).
            super_NonCopyable._vptr_NonCopyable[7])();
  pAVar10 = local_60;
  if (((char)iVar7 == '\0') &&
     (((local_60->assertionResult).m_resultData.resultType & FailureBit) == Ok)) {
    return true;
  }
  if ((local_60->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    local_50 = (undefined1  [8])&stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Expression","");
    pXVar1 = &local_58->m_xml;
    pXVar8 = XmlWriter::startElement(pXVar1,(string *)local_50);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"success","");
    pXVar8 = XmlWriter::writeAttribute
                       (pXVar8,&local_130,
                        ((pAVar10->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"type","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar5 = (pAVar10->assertionResult).m_info.macroName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_info.macroName._M_string_length);
    pXVar8 = XmlWriter::writeAttribute(pXVar8,&local_d0,&local_110);
    local_f0 = (undefined1  [8])&stack0xffffffffffffff20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"filename","");
    local_88._0_8_ = local_88 + 0x10;
    pcVar5 = (pAVar10->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_info.lineInfo.file._M_string_length);
    local_88._32_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
    pXVar8 = XmlWriter::writeAttribute(pXVar8,(string *)local_f0,(string *)local_88);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"line","");
    pAVar10 = local_60;
    pcVar5 = (local_60->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    local_b0 = (undefined1  [8])local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar5,
               pcVar5 + (local_60->assertionResult).m_info.lineInfo.file._M_string_length);
    local_a0._16_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
    XmlWriter::writeAttribute<unsigned_long>(pXVar8,&local_150,(unsigned_long *)(local_a0 + 0x10));
    pXVar8 = (XmlWriter *)(local_88 + 0x10);
    if (local_b0 != (undefined1  [8])local_a0) {
      operator_delete((void *)local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    pAVar10 = local_60;
    if ((XmlWriter *)local_88._0_8_ != pXVar8) {
      operator_delete((void *)local_88._0_8_);
    }
    if (local_f0 != (undefined1  [8])&stack0xffffffffffffff20) {
      operator_delete((void *)local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_50 != (undefined1  [8])&stack0xffffffffffffffc0) {
      operator_delete((void *)local_50);
    }
    local_88._0_8_ = pXVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Original","");
    local_50 = (undefined1  [8])pXVar1;
    XmlWriter::startElement(pXVar1,(string *)local_88);
    AssertionResult::getExpression_abi_cxx11_((string *)local_b0,&pAVar10->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_50,(string *)local_b0,true);
    if (local_b0 != (undefined1  [8])local_a0) {
      operator_delete((void *)local_b0);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_50);
    if ((XmlWriter *)local_88._0_8_ != pXVar8) {
      operator_delete((void *)local_88._0_8_);
    }
    local_88._0_8_ = pXVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Expanded","");
    local_50 = (undefined1  [8])pXVar1;
    XmlWriter::startElement(pXVar1,(string *)local_88);
    pcVar5 = (pAVar10->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
    local_b0 = (undefined1  [8])local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_resultData.reconstructedExpression.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)local_50,(string *)local_b0,true);
    if (local_b0 != (undefined1  [8])local_a0) {
      operator_delete((void *)local_b0);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_50);
    if ((XmlWriter *)local_88._0_8_ != pXVar8) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  OVar2 = (pAVar10->assertionResult).m_resultData.resultType;
  if (OVar2 < ThrewException) {
    if (OVar2 == Info) {
      local_88._0_8_ = local_88 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Info","");
      local_50 = (undefined1  [8])&local_58->m_xml;
      XmlWriter::startElement((XmlWriter *)local_50,(string *)local_88);
      local_b0 = (undefined1  [8])local_a0;
      pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_50,(string *)local_b0,true);
    }
    else {
      if (OVar2 != ExplicitFailure) goto LAB_0013b448;
      local_88._0_8_ = local_88 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Failure","");
      local_50 = (undefined1  [8])&local_58->m_xml;
      XmlWriter::startElement((XmlWriter *)local_50,(string *)local_88);
      local_b0 = (undefined1  [8])local_a0;
      pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_50,(string *)local_b0,true);
    }
    if (local_b0 != (undefined1  [8])local_a0) {
      operator_delete((void *)local_b0);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_50);
    auVar9 = (undefined1  [8])local_88._0_8_;
    if ((XmlWriter *)local_88._0_8_ == (XmlWriter *)(local_88 + 0x10)) goto LAB_0013b448;
  }
  else {
    if (OVar2 == FatalErrorCondition) {
      local_50 = (undefined1  [8])&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Fatal Error Condition","")
      ;
      local_f0 = (undefined1  [8])&local_58->m_xml;
      XmlWriter::startElement((XmlWriter *)local_f0,(string *)local_50);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"filename","");
      local_88._0_8_ = local_88 + 0x10;
      pcVar5 = (pAVar10->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_info.lineInfo.file._M_string_length);
      local_88._32_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_f0,&local_130,(string *)local_88);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      pAVar10 = local_60;
      local_b0 = (undefined1  [8])local_a0;
      pcVar5 = (local_60->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar5,
                 pcVar5 + (local_60->assertionResult).m_info.lineInfo.file._M_string_length);
      local_a0._16_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_f0,&local_d0,(unsigned_long *)(local_a0 + 0x10));
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_f0,&local_110,true);
    }
    else {
      if (OVar2 != ThrewException) goto LAB_0013b448;
      local_50 = (undefined1  [8])&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Exception","");
      local_f0 = (undefined1  [8])&local_58->m_xml;
      XmlWriter::startElement((XmlWriter *)local_f0,(string *)local_50);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"filename","");
      local_88._0_8_ = local_88 + 0x10;
      pcVar5 = (pAVar10->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_info.lineInfo.file._M_string_length);
      local_88._32_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_f0,&local_130,(string *)local_88);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      pAVar10 = local_60;
      local_b0 = (undefined1  [8])local_a0;
      pcVar5 = (local_60->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar5,
                 pcVar5 + (local_60->assertionResult).m_info.lineInfo.file._M_string_length);
      local_a0._16_8_ = (pAVar10->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_f0,&local_d0,(unsigned_long *)(local_a0 + 0x10));
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_f0,&local_110,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_b0 != (undefined1  [8])local_a0) {
      operator_delete((void *)local_b0);
    }
    pAVar10 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
    auVar9 = local_50;
    if (local_50 == (undefined1  [8])&stack0xffffffffffffffc0) goto LAB_0013b448;
  }
  operator_delete((void *)auVar9);
LAB_0013b448:
  if ((pAVar10->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&local_58->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }